

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_dist_to_edge(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *distance)

{
  REF_DBL *pRVar1;
  long lVar2;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  
  pRVar1 = ref_node->real;
  lVar3 = (long)*nodes;
  lVar2 = (long)nodes[1];
  dVar6 = pRVar1[lVar3 * 0xf];
  dVar7 = pRVar1[lVar3 * 0xf + 1];
  dVar9 = pRVar1[lVar2 * 0xf] - dVar6;
  dVar12 = pRVar1[lVar2 * 0xf + 1] - dVar7;
  dVar8 = pRVar1[lVar3 * 0xf + 2];
  dVar5 = pRVar1[lVar2 * 0xf + 2] - dVar8;
  dVar4 = (xyz[2] - dVar8) * dVar5 + (*xyz - dVar6) * dVar9 + (xyz[1] - dVar7) * dVar12;
  dVar5 = dVar5 * dVar5 + dVar9 * dVar9 + dVar12 * dVar12;
  auVar10._0_8_ = dVar5 * 1e+20;
  auVar10._8_8_ = dVar4;
  auVar11._8_8_ = -dVar4;
  auVar11._0_8_ = -auVar10._0_8_;
  auVar11 = maxpd(auVar10,auVar11);
  if (auVar11._8_8_ < auVar11._0_8_) {
    dVar4 = dVar4 / dVar5;
    dVar5 = 1.0 - dVar4;
    dVar6 = *xyz - (pRVar1[lVar2 * 0xf] * dVar4 + dVar6 * dVar5);
    dVar7 = xyz[1] - (pRVar1[lVar2 * 0xf + 1] * dVar4 + dVar7 * dVar5);
    dVar8 = xyz[2] - (dVar4 * pRVar1[lVar2 * 0xf + 2] + dVar8 * dVar5);
    *distance = SQRT(dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7);
    return 0;
  }
  *distance = 0.0;
  printf("%s: %d: %s: div zero dis %.18e len %.18e\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc32,
         "ref_node_dist_to_edge",in_R8,in_R9,pRVar1);
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_dist_to_edge(REF_NODE ref_node, REF_INT *nodes,
                                         REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL *a, *b;
  REF_DBL direction[3], diff[3], normal[3];
  REF_DBL len, dis, t;

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  direction[0] = b[0] - a[0];
  direction[1] = b[1] - a[1];
  direction[2] = b[2] - a[2];
  diff[0] = xyz[0] - a[0];
  diff[1] = xyz[1] - a[1];
  diff[2] = xyz[2] - a[2];

  dis = ref_math_dot(direction, diff);
  len = ref_math_dot(direction, direction);

  if (ref_math_divisible(dis, len)) {
    t = dis / len;
  } else {
    *distance = 0.0;
    printf("%s: %d: %s: div zero dis %.18e len %.18e\n", __FILE__, __LINE__,
           __func__, dis, len);
    return REF_DIV_ZERO;
  }

  normal[0] = xyz[0] - (t * b[0] + (1.0 - t) * a[0]);
  normal[1] = xyz[1] - (t * b[1] + (1.0 - t) * a[1]);
  normal[2] = xyz[2] - (t * b[2] + (1.0 - t) * a[2]);

  *distance = sqrt(ref_math_dot(normal, normal));

  return REF_SUCCESS;
}